

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O1

void clear_bypasses(void)

{
  level *plVar1;
  monst *pmVar2;
  monst **ppmVar3;
  obj **ppoVar4;
  obj *poVar5;
  
  plVar1 = level;
  for (poVar5 = level->objlist; poVar5 != (obj *)0x0; poVar5 = poVar5->nobj) {
    if ((*(uint *)&poVar5->field_0x4a >> 0x1a & 1) != 0) {
      *(uint *)&poVar5->field_0x4a = *(uint *)&poVar5->field_0x4a & 0xfbffffff;
    }
  }
  ppoVar4 = &magic_chest_objs;
  while (ppoVar4 = &((obj *)ppoVar4)->nobj->nobj, (obj *)ppoVar4 != (obj *)0x0) {
    ((obj *)ppoVar4)->field_0x4d = ((obj *)ppoVar4)->field_0x4d & 0xfb;
  }
  for (pmVar2 = plVar1->monlist; pmVar2 != (monst *)0x0; pmVar2 = pmVar2->nmon) {
    if (0 < pmVar2->mhp) {
      for (poVar5 = pmVar2->minvent; poVar5 != (obj *)0x0; poVar5 = poVar5->nobj) {
        poVar5->field_0x4d = poVar5->field_0x4d & 0xfb;
      }
    }
  }
  ppmVar3 = &migrating_mons;
  while (ppmVar3 = &((monst *)ppmVar3)->nmon->nmon, (monst *)ppmVar3 != (monst *)0x0) {
    for (poVar5 = ((monst *)ppmVar3)->minvent; poVar5 != (obj *)0x0; poVar5 = poVar5->nobj) {
      poVar5->field_0x4d = poVar5->field_0x4d & 0xfb;
    }
  }
  flags.bypasses = '\0';
  return;
}

Assistant:

void clear_bypasses(void)
{
	struct obj *otmp, *nobj;
	struct monst *mtmp;

	for (otmp = level->objlist; otmp; otmp = nobj) {
	    nobj = otmp->nobj;
	    if (otmp->bypass) {
		otmp->bypass = 0;
		/* bypass will have inhibited any stacking, but since it's
		   used for polymorph handling, the objects here probably
		   have been transformed and won't be stacked in the usual
		   manner afterwards; so don't bother with this */
	    }
	}
	/* invent and mydogs chains shouldn't matter here */
	for (otmp = magic_chest_objs; otmp; otmp = otmp->nobj)
	    otmp->bypass = 0;
	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
	    if (DEADMONSTER(mtmp)) continue;
	    for (otmp = mtmp->minvent; otmp; otmp = otmp->nobj)
		otmp->bypass = 0;
	}
	for (mtmp = migrating_mons; mtmp; mtmp = mtmp->nmon) {
	    for (otmp = mtmp->minvent; otmp; otmp = otmp->nobj)
		otmp->bypass = 0;
	}
	flags.bypasses = FALSE;
}